

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_mon_spell_lore_color_immune(parser *p)

{
  void *pvVar1;
  char *__s;
  size_t sVar2;
  int local_34;
  wchar_t attr;
  char *color;
  monster_spell_level *l;
  monster_spell *s;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    __s = parser_getsym(p,"color");
    sVar2 = strlen(__s);
    if (sVar2 < 2) {
      local_34 = color_char_to_attr(*__s);
    }
    else {
      local_34 = color_text_to_attr(__s);
    }
    if (local_34 < 0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_COLOR;
    }
    else {
      for (color = *(char **)((long)pvVar1 + 0x20); *(long *)color != 0; color = *(char **)color) {
      }
      color[0x1a] = (char)local_34;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_mon_spell_lore_color_immune(struct parser *p) {
	struct monster_spell *s = parser_priv(p);
	struct monster_spell_level *l;
	const char *color;
	int attr;

	if (!s) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}

	color = parser_getsym(p, "color");
	if (strlen(color) > 1) {
		attr = color_text_to_attr(color);
	} else {
		attr = color_char_to_attr(color[0]);
	}
	if (attr < 0) {
		return PARSE_ERROR_INVALID_COLOR;
	}
	l = s->level;
	while (l->next) {
		l = l->next;
	}
	l->lore_attr_immune = attr;
	return PARSE_ERROR_NONE;
}